

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pawns.cpp
# Opt level: O0

bool backward_pawn<(Color)1>(int *row,int *col,U64 *pawns)

{
  int iVar1;
  bool bVar2;
  byte local_64;
  byte local_63;
  byte local_61;
  int local_60;
  int local_5c;
  int tmp_1;
  bool no_right_pawns;
  U64 right_pawns;
  int local_40;
  int sq_1;
  int tmp;
  bool no_left_pawns;
  U64 left_pawns;
  int sq;
  bool right_greater;
  int iStack_24;
  bool left_greater;
  int right;
  int left;
  U64 *pawns_local;
  int *col_local;
  int *row_local;
  
  if (*col + -1 < 0) {
    local_5c = -1;
  }
  else {
    local_5c = *col + -1;
  }
  iStack_24 = local_5c;
  if (*col + 1 < 8) {
    local_60 = *col + 1;
  }
  else {
    local_60 = -1;
  }
  sq = local_60;
  left_pawns._7_1_ = 0;
  left_pawns._6_1_ = 0;
  _right = pawns;
  pawns_local = (U64 *)col;
  col_local = row;
  if (local_5c != -1) {
    left_pawns._0_4_ = 100;
    _tmp = (&bitboards::col)[local_5c] & *pawns;
    sq_1._3_1_ = _tmp == 0;
    while (_tmp != 0) {
      local_40 = bits::pop_lsb((U64 *)&tmp);
      if (local_40 < (int)left_pawns) {
        left_pawns._0_4_ = local_40;
      }
    }
    if ((int)left_pawns < 100) {
      iVar1 = util::row((int *)&left_pawns);
      local_61 = 1;
      if (*col_local <= iVar1) goto LAB_00146c75;
    }
    else {
LAB_00146c75:
      local_61 = sq_1._3_1_;
    }
    left_pawns._7_1_ = local_61 & 1;
  }
  if (sq != -1) {
    right_pawns._4_4_ = 100;
    _tmp_1 = (&bitboards::col)[sq] & *_right;
    bVar2 = _tmp_1 == 0;
    while (_tmp_1 != 0) {
      iVar1 = bits::pop_lsb((U64 *)&tmp_1);
      if (iVar1 < right_pawns._4_4_) {
        right_pawns._4_4_ = iVar1;
      }
    }
    if (right_pawns._4_4_ < 100) {
      iVar1 = util::row((int *)((long)&right_pawns + 4));
      left_pawns._6_1_ = 1;
      if (iVar1 < *col_local) goto LAB_00146d06;
    }
    left_pawns._6_1_ = bVar2;
  }
LAB_00146d06:
  if (((iStack_24 != -1) || (local_63 = 1, (left_pawns._6_1_ & 1) == 0)) &&
     ((sq != -1 || (local_63 = 1, (left_pawns._7_1_ & 1) == 0)))) {
    local_64 = 0;
    if ((left_pawns._7_1_ & 1) != 0) {
      local_64 = left_pawns._6_1_;
    }
    local_63 = local_64;
  }
  return (bool)(local_63 & 1);
}

Assistant:

inline bool backward_pawn(const int& row, const int& col, const U64& pawns) {
	int left = col - 1 < Col::A ? -1 : col - 1;
	int right = col + 1 > Col::H ? -1 : col + 1;
	bool left_greater = false;
	bool right_greater = false;

	if (c == white) {
		if (left != -1) {
			int sq = -1;
			U64 left_pawns = bitboards::col[left] & pawns;
			while (left_pawns) {
				int tmp = bits::pop_lsb(left_pawns);
				if (tmp > sq) sq = tmp;
			}
			left_greater = sq > 0 && util::row(sq) > row;
		}

		if (right != -1) {
			int sq = -1;
			U64 right_pawns = bitboards::col[right] & pawns;
			bool no_right_pawns = (right_pawns == 0ULL);
			while (right_pawns) {
				int tmp = bits::pop_lsb(right_pawns);
				if (tmp > sq) sq = tmp;
			}
			right_greater = sq > 0 && util::row(sq) > row || no_right_pawns;
		}
	}
	else {
		if (left != -1) {
			int sq = 100;
			U64 left_pawns = bitboards::col[left] & pawns;
			bool no_left_pawns = (left_pawns == 0ULL);
			while (left_pawns) {
				int tmp = bits::pop_lsb(left_pawns);
				if (tmp < sq) sq = tmp;
			}
			left_greater = sq < 100 && util::row(sq) < row || no_left_pawns;
		}
		if (right != -1) {
			int sq = 100;
			U64 right_pawns = bitboards::col[right] & pawns;
			bool no_right_pawns = (right_pawns == 0ULL);
			while (right_pawns) {
				int tmp = bits::pop_lsb(right_pawns);
				if (tmp < sq) sq = tmp;
			}
			right_greater = sq < 100 && util::row(sq) < row || no_right_pawns;
		}
	}

	return (left == -1 && right_greater) ||
		(right == -1 && left_greater) ||
		(left_greater && right_greater);
}